

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

ByteData256 * __thiscall
cfd::core::TapBranch::GetTapTweak
          (ByteData256 *__return_storage_ptr__,TapBranch *this,SchnorrPubkey *internal_pubkey)

{
  bool bVar1;
  int iVar2;
  HashUtil *pHVar3;
  HashUtil hasher;
  ByteData256 hash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  HashUtil local_40;
  
  GetCurrentBranchHash(&hash,this);
  if (GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash == '\0') {
    iVar2 = __cxa_guard_acquire(&GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash);
    if (iVar2 != 0) {
      ::std::__cxx11::string::string((string *)&hasher,"TapTweak",(allocator *)&local_40);
      HashUtil::Sha256(&GetTapTweak::kTaggedHash,(string *)&hasher);
      ::std::__cxx11::string::~string((string *)&hasher);
      __cxa_atexit(ByteData256::~ByteData256,&GetTapTweak::kTaggedHash,&__dso_handle);
      __cxa_guard_release(&GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash);
    }
  }
  HashUtil::HashUtil(&local_40,'\x03');
  pHVar3 = HashUtil::operator<<(&local_40,&GetTapTweak::kTaggedHash);
  pHVar3 = HashUtil::operator<<(pHVar3,&GetTapTweak::kTaggedHash);
  SchnorrPubkey::GetData((ByteData *)&local_58,internal_pubkey);
  pHVar3 = HashUtil::operator<<(pHVar3,(ByteData *)&local_58);
  HashUtil::HashUtil(&hasher,pHVar3);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  HashUtil::~HashUtil(&local_40);
  bVar1 = ByteData256::IsEmpty(&hash);
  if (!bVar1) {
    HashUtil::operator<<(&hasher,&hash);
  }
  HashUtil::Output256(__return_storage_ptr__,&hasher);
  HashUtil::~HashUtil(&hasher);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetTapTweak(
    const SchnorrPubkey& internal_pubkey) const {
  ByteData256 hash = GetCurrentBranchHash();
  static auto kTaggedHash = HashUtil::Sha256("TapTweak");
  auto hasher = HashUtil(HashUtil::kSha256)
                << kTaggedHash << kTaggedHash << internal_pubkey.GetData();
  if (!hash.IsEmpty()) hasher << hash;
  return hasher.Output256();
}